

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O0

void __thiscall wasm::SafeHeap::addStoreFunc(SafeHeap *this,Store style,Module *module)

{
  Type type;
  initializer_list<wasm::Type> __l;
  Signature sig;
  initializer_list<wasm::Type> types;
  Block *pBVar1;
  BinaryOp op;
  Function *pFVar2;
  Memory *this_00;
  ExpressionList *pEVar3;
  LocalGet *pLVar4;
  LocalGet *right;
  Binary *value;
  LocalSet *item;
  Expression *pEVar5;
  address64_t aVar6;
  pointer pFVar7;
  Name NVar8;
  optional<wasm::Type> type_;
  BasicType local_1c4;
  undefined1 local_1c0 [12];
  uintptr_t local_1b0;
  uintptr_t local_1a8;
  Store *local_1a0;
  Store *store;
  char *pcStack_190;
  address64_t local_180;
  size_t local_178;
  char *pcStack_170;
  uintptr_t local_160;
  uintptr_t local_158;
  uintptr_t local_150;
  uintptr_t local_148;
  Block *local_140;
  Block *block;
  Builder builder;
  allocator<wasm::Type> local_119;
  Type local_118;
  iterator local_110;
  size_type local_108;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_100;
  uintptr_t local_e8;
  uintptr_t uStack_e0;
  HeapType local_d0;
  char *local_c8;
  HeapType HStack_c0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_b8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  Type local_a8;
  uintptr_t local_a0;
  uintptr_t local_98;
  iterator local_90;
  undefined8 local_88;
  Type local_80;
  undefined1 auStack_78 [8];
  Signature funcSig;
  bool is64;
  Type addressType;
  Memory *memory;
  char *pcStack_28;
  Name name;
  Module *module_local;
  SafeHeap *this_local;
  
  NVar8 = getStoreName(&style);
  pcStack_28 = NVar8.super_IString.str._M_len;
  name.super_IString.str._M_len = NVar8.super_IString.str._M_str;
  pFVar2 = Module::getFunctionOrNull(module,NVar8);
  if (pFVar2 == (Function *)0x0) {
    this_00 = Module::getMemory(module,style.memory);
    type.id = (this_00->addressType).id;
    funcSig.results.id._7_1_ = Memory::is64(this_00);
    local_98 = style.valueType.id;
    local_90 = &local_a8;
    local_88 = 3;
    types._M_len = 3;
    types._M_array = local_90;
    local_a8.id = type.id;
    local_a0 = type.id;
    wasm::Type::Type(&local_80,types);
    wasm::Type::Type((Type *)&func,none);
    Signature::Signature
              ((Signature *)auStack_78,local_80,
               (Type)func._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    local_c8 = pcStack_28;
    HStack_c0.id = name.super_IString.str._M_len;
    local_e8 = (uintptr_t)auStack_78;
    uStack_e0 = funcSig.params.id;
    sig.results.id = funcSig.params.id;
    sig.params.id = (uintptr_t)auStack_78;
    HeapType::HeapType(&local_d0,sig);
    local_110 = &local_118;
    local_108 = 1;
    local_118.id = type.id;
    std::allocator<wasm::Type>::allocator(&local_119);
    __l._M_len = local_108;
    __l._M_array = local_110;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_100,__l,&local_119);
    NVar8.super_IString.str._M_str = local_c8;
    NVar8.super_IString.str._M_len = (size_t)&local_b8;
    Builder::makeFunction
              (NVar8,HStack_c0,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_d0.id,
               (Expression *)&local_100);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_100);
    std::allocator<wasm::Type>::~allocator(&local_119);
    Builder::Builder((Builder *)&block,module);
    local_140 = Builder::makeBlock((Builder *)&block,(Expression *)0x0);
    pEVar3 = &local_140->list;
    op = AddInt32;
    if ((funcSig.results.id._7_1_ & 1) != 0) {
      op = AddInt64;
    }
    local_148 = type.id;
    pLVar4 = Builder::makeLocalGet((Builder *)&block,0,type);
    local_150 = type.id;
    right = Builder::makeLocalGet((Builder *)&block,1,type);
    value = Builder::makeBinary((Builder *)&block,op,(Expression *)pLVar4,(Expression *)right);
    item = Builder::makeLocalSet((Builder *)&block,3,(Expression *)value);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    pEVar3 = &local_140->list;
    local_158 = style.valueType.id;
    local_178 = (this_00->super_Importable).super_Named.name.super_IString.str._M_len;
    pcStack_170 = (this_00->super_Importable).super_Named.name.super_IString.str._M_str;
    local_160 = type.id;
    pEVar5 = makeBoundsCheck(this,style.valueType,(Builder *)&block,0,3,(uint)style.bytes,module,
                             type,(bool)(funcSig.results.id._7_1_ & 1),
                             (Name)(this_00->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar5);
    aVar6 = wasm::Address::operator_cast_to_unsigned_long(&style.align);
    if (1 < aVar6) {
      pEVar3 = &local_140->list;
      local_180 = style.align.addr;
      store = (Store *)(this_00->super_Importable).super_Named.name.super_IString.str._M_len;
      pcStack_190 = (this_00->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar5 = makeAlignCheck(this,style.align,(Builder *)&block,3,module,
                              (Name)(this_00->super_Importable).super_Named.name.super_IString.str);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar3->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,pEVar5);
    }
    local_1a0 = MixedArena::alloc<wasm::Store>(&module->allocator);
    Store::operator=(local_1a0,&style);
    wasm::Name::operator=(&local_1a0->memory,(Name *)this_00);
    local_1a8 = type.id;
    pLVar4 = Builder::makeLocalGet((Builder *)&block,3,type);
    local_1a0->ptr = (Expression *)pLVar4;
    local_1b0 = style.valueType.id;
    pLVar4 = Builder::makeLocalGet((Builder *)&block,2,style.valueType);
    local_1a0->value = (Expression *)pLVar4;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_140->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)local_1a0);
    pBVar1 = local_140;
    local_1c4 = none;
    std::optional<wasm::Type>::optional<wasm::Type::BasicType,_true>
              ((optional<wasm::Type> *)local_1c0,&local_1c4);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_1c0._0_8_;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1c0[8];
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_1c0._9_3_;
    Block::finalize(pBVar1,type_,Unknown);
    pBVar1 = local_140;
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_b8);
    pFVar7->body = (Expression *)pBVar1;
    Module::addFunction(module,&local_b8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_b8);
  }
  return;
}

Assistant:

void addStoreFunc(Store style, Module* module) {
    auto name = getStoreName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    bool is64 = memory->is64();
    // pointer, offset, value
    auto funcSig =
      Signature({addressType, addressType, style.valueType}, Type::none);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      3,
      builder.makeBinary(is64 ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.valueType,
                                          builder,
                                          0,
                                          3,
                                          style.bytes,
                                          module,
                                          addressType,
                                          is64,
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 3, module, memory->name));
    }
    // do the store
    auto* store = module->allocator.alloc<Store>();
    *store = style; // basically the same as the template we are given!
    store->memory = memory->name;
    store->ptr = builder.makeLocalGet(3, addressType);
    store->value = builder.makeLocalGet(2, style.valueType);
    block->list.push_back(store);
    block->finalize(Type::none);
    func->body = block;
    module->addFunction(std::move(func));
  }